

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qgraphicsview.cpp
# Opt level: O2

QPolygon * __thiscall
QGraphicsView::mapFromScene(QPolygon *__return_storage_ptr__,QGraphicsView *this,QPolygonF *polygon)

{
  long lVar1;
  QPointF *point;
  QPointF *point_00;
  long in_FS_OFFSET;
  QPoint local_38;
  long local_30;
  
  local_30 = *(long *)(in_FS_OFFSET + 0x28);
  (__return_storage_ptr__->super_QList<QPoint>).d.d = (Data *)0x0;
  (__return_storage_ptr__->super_QList<QPoint>).d.ptr = (QPoint *)0x0;
  (__return_storage_ptr__->super_QList<QPoint>).d.size = 0;
  QList<QPoint>::reserve
            (&__return_storage_ptr__->super_QList<QPoint>,(polygon->super_QList<QPointF>).d.size);
  point_00 = (polygon->super_QList<QPointF>).d.ptr;
  for (lVar1 = (polygon->super_QList<QPointF>).d.size << 4; lVar1 != 0; lVar1 = lVar1 + -0x10) {
    local_38 = mapFromScene(this,point_00);
    QList<QPoint>::emplaceBack<QPoint>(&__return_storage_ptr__->super_QList<QPoint>,&local_38);
    point_00 = point_00 + 1;
  }
  if (*(long *)(in_FS_OFFSET + 0x28) == local_30) {
    return __return_storage_ptr__;
  }
  __stack_chk_fail();
}

Assistant:

QPolygon QGraphicsView::mapFromScene(const QPolygonF &polygon) const
{
    QPolygon poly;
    poly.reserve(polygon.size());
    for (const QPointF &point : polygon)
        poly << mapFromScene(point);
    return poly;
}